

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O1

void duckdb::VerifyHeapSizes
               (data_ptr_t *source_locations,idx_t *heap_sizes,SelectionVector *append_sel,
               idx_t append_count,idx_t heap_size_offset)

{
  return;
}

Assistant:

void VerifyHeapSizes(const data_ptr_t source_locations[], const idx_t heap_sizes[], const SelectionVector &append_sel,
                     const idx_t append_count, const idx_t heap_size_offset) {
#ifdef DEBUG
	for (idx_t i = 0; i < append_count; i++) {
		auto idx = append_sel.get_index(i);
		const auto stored_heap_size = Load<uint32_t>(source_locations[idx] + heap_size_offset);
		D_ASSERT(stored_heap_size == heap_sizes[idx]);
	}
#endif
}